

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

Image * Image_Function_Helper::Transpose
                  (Image *__return_storage_ptr__,TransposeForm4 transpose,Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_height,in->_width,'\x01','\x01');
  (*transpose)(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height);
  return __return_storage_ptr__;
}

Assistant:

Image Transpose( FunctionTable::TransposeForm4 transpose,
                     const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.height(), in.width() );

        transpose( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }